

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space_mixer.c
# Opt level: O1

void calculate_volumes(space_source *source,space_mixer_data *data)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  mixed_channel_t speaker_count;
  float location [3];
  mixed_channel_t speakers [33];
  float volumes [33];
  byte local_f1;
  float local_f0;
  float fStack_ec;
  float local_e8;
  float local_e4;
  float local_e0;
  float local_dc;
  byte local_d8 [48];
  float local_a8 [34];
  
  local_dc = source->min_distance;
  local_e4 = source->max_distance;
  local_e0 = source->rolloff;
  local_f0 = source->location[0] - data->location[0];
  fStack_ec = source->location[1] - data->location[1];
  local_e8 = source->location[2] - data->location[2];
  fVar4 = local_e8 * local_e8 + local_f0 * local_f0 + fStack_ec * fStack_ec;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    auVar1 = vsqrtss_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
    fVar4 = auVar1._0_4_;
  }
  fVar6 = local_e4;
  if (fVar4 < local_e4) {
    fVar4 = local_e8 * local_e8 + local_f0 * local_f0 + fStack_ec * fStack_ec;
    if (fVar4 < 0.0) {
      fVar4 = sqrtf(fVar4);
      fVar6 = local_e4;
      local_e4 = fVar4;
    }
    else {
      auVar1 = vsqrtss_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
      local_e4 = auVar1._0_4_;
    }
  }
  fVar4 = 1.0;
  if ((local_dc < fVar6) && (fVar4 = 1.0, local_dc < local_e4)) {
    fVar4 = (*data->attenuation)(local_dc,fVar6,local_e4,local_e0);
  }
  local_e0 = fVar4;
  if (source->spatial == true) {
    fVar4 = local_e8 * data->look_at[2] + local_f0 * data->look_at[0] + fStack_ec * data->look_at[1]
    ;
    fVar6 = local_e8 * data->look_at[5] + local_f0 * data->look_at[3] + fStack_ec * data->look_at[4]
    ;
    local_e8 = local_e8 * data->look_at[8] +
               local_f0 * data->look_at[6] + fStack_ec * data->look_at[7];
    local_f0 = fVar4;
    fStack_ec = fVar6;
    if (local_e4 < local_dc) {
      fVar5 = 1.0 - local_e4 / local_dc;
      auVar1 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar5 + fVar5)));
      fVar7 = auVar1._0_4_;
      fVar5 = 1.0 - fVar7;
      local_f0 = fVar4 * fVar5 + fVar7 * 0.0;
      fStack_ec = fVar6 * fVar5 + fVar7 * 0.0;
      local_e8 = local_e8 * fVar5 + fVar7;
    }
    mixed_compute_gains_resolver(&local_f0,local_a8,local_d8,&local_f1,&data->vbap);
    if ((ulong)local_f1 != 0) {
      uVar2 = 0;
      do {
        auVar1 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),
                            ZEXT416((uint)(local_e0 * local_a8[uVar2])));
        local_a8[uVar2] = auVar1._0_4_;
        uVar2 = uVar2 + 1;
      } while (local_f1 != uVar2);
    }
    if ((local_dc < local_e4) && (data->surround == false)) {
      fVar4 = local_e8 * local_e8 + local_f0 * local_f0 + fStack_ec * fStack_ec;
      if (fVar4 < 0.0) {
        fVar4 = sqrtf(fVar4);
      }
      else {
        auVar1 = vsqrtss_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
        fVar4 = auVar1._0_4_;
      }
      fVar7 = 0.0;
      fVar6 = 0.0;
      fVar5 = 0.0;
      if (0.0 < fVar4) {
        fVar7 = local_f0 / fVar4;
        fVar5 = local_e8 / fVar4;
        fVar6 = (fStack_ec / fVar4) * 0.0;
      }
      if ((fVar5 + fVar7 * 0.0 + fVar6 < 0.0) && ((ulong)local_f1 != 0)) {
        uVar2 = 0;
        do {
          uVar3 = (ulong)(data->channels).positions[local_d8[uVar2]];
          if ((uVar3 < 0x21) && ((0x122020202U >> (uVar3 & 0x3f) & 1) != 0)) {
            local_a8[uVar2] = -local_a8[uVar2];
          }
          uVar2 = uVar2 + 1;
        } while (local_f1 != uVar2);
      }
    }
  }
  else {
    local_f0 = 0.0;
    fStack_ec = 0.0;
    local_e8 = 0.0;
    mixed_compute_gains_resolver(&local_f0,local_a8,local_d8,&local_f1,&data->vbap);
    if ((ulong)local_f1 != 0) {
      uVar2 = 0;
      do {
        auVar1 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),
                            ZEXT416((uint)(local_e0 * local_a8[uVar2])));
        local_a8[uVar2] = auVar1._0_4_;
        uVar2 = uVar2 + 1;
      } while (local_f1 != uVar2);
    }
  }
  memcpy(source->volumes,local_a8,(ulong)local_f1 << 2);
  memcpy(source->speakers,local_d8,(ulong)local_f1 << 2);
  source->speaker_count = local_f1;
  return;
}

Assistant:

VECTORIZE static void calculate_volumes(struct space_source *source, struct space_mixer_data *data){
  float volumes[MIXED_MAX_SPEAKER_COUNT];
  mixed_channel_t speakers[MIXED_MAX_SPEAKER_COUNT];
  mixed_channel_t speaker_count;
  float forward[3] = {0.0, 0.0, 1.0};
  float min = source->min_distance;
  float max = source->max_distance;
  float roll = source->rolloff;
  // Relative location to our listener
  float location[3] = {source->location[0]-data->location[0],
                       source->location[1]-data->location[1],
                       source->location[2]-data->location[2]};
  float distance = MIN(vec_length(location), max);
  float volume = 1.0;
  if(min < distance && min < max){
    volume *= data->attenuation(min, max, distance, roll);
  }
  if(source->spatial){
    // Bring the location into our reference frame
    vec_mul(location, data->look_at, location);
    // If we are below min distance, bend towards forward
    if(distance < min){
      vec_lerp(location, location, forward, MIN(1.0, (1-distance/min)*2));
    }
    // Compute the actual gain factors using VBAP
    mixed_compute_gains(location, volumes, speakers, &speaker_count, &data->vbap);
    for(mixed_channel_t c=0; c<speaker_count; ++c){
      volumes[c] = MIN(1.0, volume*volumes[c]);
    }
    // If we are not on a surround setup, we can simulate the sound appearing
    // from behind by inverting the right channels, causing a phase shift.
    // Only do this when the sound is far enough away though as otherwise it
    // can lead to frequent fluctuations, which sound very... bad.
    if(!data->surround && min < distance && calculate_phase(location) < 0){
      for(mixed_channel_t c=0; c<speaker_count; ++c){
        switch(data->channels.positions[speakers[c]]){
        case MIXED_RIGHT_FRONT_BOTTOM:
        case MIXED_RIGHT_FRONT_TOP:
        case MIXED_RIGHT_FRONT_WIDE:
        case MIXED_RIGHT_FRONT_HIGH:
        case MIXED_RIGHT_CENTER_BOTTOM:
        case MIXED_RIGHT_FRONT_CENTER_BOTTOM:
          volumes[c] *= -1.0;
        }
      }
    }
  }else{
    location[0] = 0.0;
    location[1] = 0.0;
    location[2] = 0.0;
    mixed_compute_gains(location, volumes, speakers, &speaker_count, &data->vbap);
    for(mixed_channel_t c=0; c<speaker_count; ++c){
      volumes[c] = MIN(1.0, volume*volumes[c]);
    }
  }
  // Cache
  memcpy(source->volumes, volumes, sizeof(float)*speaker_count);
  memcpy(source->speakers, speakers, sizeof(float)*speaker_count);
  source->speaker_count = speaker_count;
}